

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

undefined1  [16] __thiscall
cfd::api::ElementsTransactionApi::EstimateFee
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *utxos,ConfidentialAssetId *fee_asset,Amount *txout_fee,Amount *utxo_fee,bool is_blind,
          uint64_t effective_fee_rate,int exponent,int minimum_bits,uint32_t *append_asset_count)

{
  Script SVar1;
  Script SVar2;
  Script SVar3;
  Script SVar4;
  AddressType AVar5;
  byte bVar6;
  bool bVar7;
  uint32_t uVar8;
  reference pvVar9;
  size_type sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined1 auVar14 [16];
  byte in_stack_00000008;
  uint64_t in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  int *in_stack_00000028;
  uint32_t total_vsize;
  Amount utxo_fee_amount;
  Amount tx_fee_amount;
  FeeCalculator fee_calc;
  uint32_t tx_vsize;
  uint32_t tx_size;
  uint32_t tx_witness_size;
  uint32_t utxo_vsize;
  CfdException *except;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> pegin_stack;
  ConfidentialTxInReference ref;
  bool is_blind_issuance;
  bool is_reissuance;
  bool is_issuance;
  Script *scriptsig_template;
  Script redeem_script;
  AddressType addr_type;
  DescriptorScriptData data;
  string descriptor;
  Script claim_script;
  uint32_t pegin_txoutproof_size;
  uint32_t pegin_btc_tx_size;
  ElementsAddressFactory factory;
  NetType_conflict net_type;
  ElementsUtxoAndOption *utxo;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *__range2_1;
  uint32_t not_witness_count;
  uint32_t asset_count;
  uint32_t rangeproof_size_cache;
  uint32_t txin_size;
  uint32_t wit_size;
  uint32_t witness_size;
  uint32_t size;
  ConfidentialTxOutReference *txout;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *__range2;
  bool exist_fee;
  ConfidentialTransactionContext txc;
  Amount fee;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *in_stack_000017e8;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *in_stack_000017f0;
  string *in_stack_000017f8;
  string *in_stack_00001800;
  AddressFactory *in_stack_00001808;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_00001820;
  undefined4 in_stack_fffffffffffff328;
  undefined4 uVar15;
  int iVar16;
  undefined4 in_stack_fffffffffffff32c;
  undefined4 uVar17;
  Script *__rhs;
  DescriptorScriptData *in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff33c;
  long *args_1;
  DescriptorScriptData *in_stack_fffffffffffff340;
  uint in_stack_fffffffffffff348;
  CfdError in_stack_fffffffffffff34c;
  uint in_stack_fffffffffffff350;
  undefined4 in_stack_fffffffffffff354;
  undefined4 in_stack_fffffffffffff358;
  undefined4 in_stack_fffffffffffff35c;
  undefined4 *puVar18;
  uint32_t in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff364;
  undefined4 in_stack_fffffffffffff368;
  NetType in_stack_fffffffffffff36c;
  ElementsAddressFactory *in_stack_fffffffffffff370;
  undefined8 in_stack_fffffffffffff378;
  undefined7 in_stack_fffffffffffff380;
  undefined1 in_stack_fffffffffffff387;
  undefined8 in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff390;
  undefined4 in_stack_fffffffffffff394;
  uint *in_stack_fffffffffffff398;
  undefined7 in_stack_fffffffffffff3a0;
  undefined1 in_stack_fffffffffffff3a7;
  undefined8 in_stack_fffffffffffff3a8;
  int in_stack_fffffffffffff3b0;
  undefined4 in_stack_fffffffffffff3b8;
  undefined4 in_stack_fffffffffffff3bc;
  byte local_c09;
  undefined8 in_stack_fffffffffffff400;
  uint32_t in_stack_fffffffffffff408;
  byte in_stack_fffffffffffff40c;
  byte in_stack_fffffffffffff40d;
  byte in_stack_fffffffffffff40e;
  byte in_stack_fffffffffffff40f;
  byte in_stack_fffffffffffff410;
  byte in_stack_fffffffffffff411;
  byte in_stack_fffffffffffff412;
  byte in_stack_fffffffffffff413;
  byte in_stack_fffffffffffff414;
  byte in_stack_fffffffffffff415;
  byte in_stack_fffffffffffff416;
  byte in_stack_fffffffffffff417;
  undefined1 in_stack_fffffffffffff41f;
  ConfidentialTransactionContext *in_stack_fffffffffffff420;
  _func_int **in_stack_fffffffffffff430;
  FeeCalculator local_b0c;
  undefined4 local_b08;
  uint local_b04;
  uint local_b00;
  undefined4 local_afc;
  Script local_af8;
  Script local_ac0 [2];
  Script local_a40;
  Script local_a08;
  byte local_9c9;
  Script local_9b0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_958 [3];
  byte local_909;
  OutPoint local_8d8;
  undefined1 local_8b0 [357];
  byte local_74b;
  byte local_74a;
  byte local_749;
  DescriptorScriptData *local_748;
  Script local_740;
  string local_708 [32];
  AddressType local_6e8;
  undefined1 local_6e1 [481];
  AddressType local_500;
  Script local_4f8 [6];
  string local_388 [32];
  Script local_368;
  uint32_t local_330;
  uint32_t local_32c;
  string local_300 [36];
  NetType local_2dc;
  reference local_2d8;
  ElementsUtxoAndOption *local_2d0;
  __normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
  local_2c8;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *local_2c0;
  uint local_2b4;
  int local_2b0;
  undefined4 local_2ac;
  undefined1 local_2a8 [8];
  uint local_2a0;
  uint local_29c;
  _func_int **local_298;
  undefined1 local_290;
  undefined1 local_288 [24];
  string local_270 [32];
  char *local_250;
  undefined4 local_248;
  char *local_240;
  string local_238 [72];
  string local_1f0 [88];
  reference local_198;
  undefined4 local_18c;
  ConfidentialTxOutReference *local_188;
  __normal_iterator<const_cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
  local_180;
  undefined1 local_178 [24];
  undefined1 *local_160;
  byte local_153;
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  char *local_130;
  undefined4 local_128;
  char *local_120;
  Amount local_108 [191];
  byte local_49;
  undefined8 *local_48;
  undefined8 *local_40;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *local_30;
  undefined8 local_18;
  undefined1 local_10;
  
  local_49 = in_stack_00000008 & 1;
  local_48 = in_R9;
  local_40 = in_R8;
  local_30 = in_RDX;
  ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  bVar6 = cfd::core::ConfidentialAssetId::IsEmpty();
  if ((bVar6 & 1) != 0) {
    local_130 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                        ,0x2f);
    local_130 = local_130 + 1;
    local_128 = 0x228;
    local_120 = "EstimateFee";
    core::logger::warn<>
              ((CfdSourceLocation *)in_stack_fffffffffffff330,
               (char *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
    local_152 = 1;
    uVar11 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"Empty fee asset.",&local_151);
    core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
               in_stack_fffffffffffff34c,(string *)in_stack_fffffffffffff340);
    local_152 = 0;
    __cxa_throw(uVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_153 = 0;
  cfd::core::ConfidentialTransaction::GetTxOutList();
  local_160 = local_178;
  local_180._M_current =
       (ConfidentialTxOutReference *)
       std::
       vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
       ::begin((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_188 = (ConfidentialTxOutReference *)
              std::
              vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ::end((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                     *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  while (bVar7 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
                             *)in_stack_fffffffffffff330,
                            (__normal_iterator<const_cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
                             *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328)), bVar7
        ) {
    local_198 = __gnu_cxx::
                __normal_iterator<const_cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
                ::operator*(&local_180);
    core::AbstractTxOutReference::GetLockingScript
              ((AbstractTxOutReference *)
               CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
    bVar6 = cfd::core::Script::IsEmpty();
    core::Script::~Script((Script *)in_stack_fffffffffffff330);
    if ((bVar6 & 1) != 0) {
      core::ConfidentialTxOutReference::GetAsset
                ((ConfidentialTxOutReference *)
                 CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff330,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_1f0);
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x420c82);
      if (bVar7) {
        local_250 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                            ,0x2f);
        local_250 = local_250 + 1;
        local_248 = 0x231;
        local_240 = "EstimateFee";
        core::logger::warn<>
                  ((CfdSourceLocation *)in_stack_fffffffffffff330,
                   (char *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
        local_288[0x16] = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_270,"Unmatch fee asset.",(allocator *)(local_288 + 0x17))
        ;
        core::CfdException::CfdException
                  ((CfdException *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                   in_stack_fffffffffffff34c,(string *)in_stack_fffffffffffff340);
        local_288[0x16] = 0;
        __cxa_throw(uVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_153 = 1;
      break;
    }
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
    ::operator++(&local_180);
  }
  local_18c = 2;
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)in_stack_fffffffffffff340);
  if ((local_153 & 1) == 0) {
    in_stack_fffffffffffff430 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(1);
    local_298 = in_stack_fffffffffffff430;
    local_290 = extraout_DL;
    local_288._0_8_ = in_stack_fffffffffffff430;
    local_288[8] = extraout_DL;
    cfd::core::ConfidentialTransaction::AddTxOutFee(local_108,(ConfidentialAssetId *)local_288);
  }
  local_29c = 0;
  local_2a0 = 0;
  local_2a8._4_4_ = 0;
  local_2a8._0_4_ = kDescriptorScriptNull;
  local_2ac = 0;
  local_2b0 = 0;
  local_2b4 = 0;
  local_2c0 = local_30;
  local_2c8._M_current =
       (ElementsUtxoAndOption *)
       std::
       vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
       begin((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_2d0 = (ElementsUtxoAndOption *)
              std::
              vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              ::end((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                     *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  puVar18 = (undefined4 *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358);
  args_1 = (long *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338);
  __rhs = (Script *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328);
  do {
    bVar7 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
                        *)in_stack_fffffffffffff330,
                       (__normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
                        *)__rhs);
    uVar8 = (uint32_t)in_stack_fffffffffffff430;
    uVar15 = (undefined4)((ulong)__rhs >> 0x20);
    if (!bVar7) {
      if (((local_2a0 != 0) && (local_2b4 != 0)) &&
         (uVar13 = local_2b4,
         sVar10 = std::
                  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                  ::size(local_30), uVar13 < (uint)sVar10)) {
        local_2a0 = local_2b4 * 4 + local_2a0;
      }
      local_afc = cfd::core::AbstractTransaction::GetVsizeFromSize(local_29c,local_2a0);
      local_b00 = 0;
      local_b04 = 0;
      if (in_stack_00000028 != (int *)0x0) {
        if ((uint)(local_2b0 + *in_stack_00000028) < 0xff) {
          local_2b0 = *in_stack_00000028 + local_2b0;
        }
        else {
          local_2b0 = 0xff;
        }
      }
      iVar16 = local_2b0;
      ConfidentialTransactionContext::GetSizeIgnoreTxIn
                (in_stack_fffffffffffff420,(bool)in_stack_fffffffffffff41f,
                 (uint32_t *)
                 CONCAT17(in_stack_fffffffffffff417,
                          CONCAT16(in_stack_fffffffffffff416,
                                   CONCAT15(in_stack_fffffffffffff415,
                                            CONCAT14(in_stack_fffffffffffff414,
                                                     CONCAT13(in_stack_fffffffffffff413,
                                                              CONCAT12(in_stack_fffffffffffff412,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff411,
                                                  in_stack_fffffffffffff410))))))),
                 (uint32_t *)
                 CONCAT17(in_stack_fffffffffffff40f,
                          CONCAT16(in_stack_fffffffffffff40e,
                                   CONCAT15(in_stack_fffffffffffff40d,
                                            CONCAT14(in_stack_fffffffffffff40c,
                                                     in_stack_fffffffffffff408)))),
                 (int)((ulong)in_stack_fffffffffffff400 >> 0x20),(int)in_stack_fffffffffffff400,
                 uVar8);
      local_b08 = cfd::core::AbstractTransaction::GetVsizeFromSize(local_b04,local_b00);
      FeeCalculator::FeeCalculator(&local_b0c,in_stack_00000010);
      uVar11 = FeeCalculator::GetFee
                         ((FeeCalculator *)
                          CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                          (uint32_t)((ulong)puVar18 >> 0x20));
      uVar12 = FeeCalculator::GetFee
                         ((FeeCalculator *)
                          CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                          (uint32_t)((ulong)puVar18 >> 0x20));
      cfd::core::AbstractTransaction::GetVsizeFromSize(local_b04 + local_29c,local_b00 + local_2a0);
      local_18 = FeeCalculator::GetFee
                           ((FeeCalculator *)
                            CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                            (uint32_t)((ulong)puVar18 >> 0x20));
      if (local_40 != (undefined8 *)0x0) {
        *local_40 = uVar11;
        *(undefined1 *)(local_40 + 1) = extraout_DL_00;
      }
      if (local_48 != (undefined8 *)0x0) {
        *local_48 = uVar12;
        *(undefined1 *)(local_48 + 1) = extraout_DL_01;
      }
      local_10 = extraout_DL_02;
      strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
              ,0x2f);
      cfd::core::Amount::GetSatoshiValue();
      cfd::core::Amount::GetSatoshiValue();
      cfd::core::Amount::GetSatoshiValue();
      core::logger::info<unsigned_long&,long,long,long>
                ((CfdSourceLocation *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                 (char *)CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
                 (unsigned_long *)in_stack_fffffffffffff340,args_1,(long *)in_stack_fffffffffffff330
                 ,(long *)CONCAT44(uVar15,iVar16));
      local_18c = 1;
      ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)in_stack_fffffffffffff330);
      auVar14._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      auVar14[8] = local_10;
      auVar14._0_8_ = local_18;
      return auVar14;
    }
    local_2d8 = __gnu_cxx::
                __normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
                ::operator*(&local_2c8);
    local_2dc = kLiquidV1;
    cfd::core::Address::GetAddress_abi_cxx11_();
    bVar6 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_300);
    if (((bVar6 ^ 0xff) & 1) != 0) {
      local_2dc = core::Address::GetNetType(&(local_2d8->utxo).address);
    }
    ElementsAddressFactory::ElementsAddressFactory
              (in_stack_fffffffffffff370,in_stack_fffffffffffff36c);
    local_32c = 0;
    local_330 = 0;
    local_2a8._0_4_ = kDescriptorScriptNull;
    local_2a8._4_4_ = 0;
    cfd::core::Script::Script(&local_368);
    if ((local_2d8->is_pegin & 1U) != 0) {
      local_32c = local_2d8->pegin_btc_tx_size;
      local_330 = local_2d8->pegin_txoutproof_size;
      cfd::core::Script::operator=(&local_368,&local_2d8->claim_script);
    }
    std::__cxx11::string::string(local_388,(string *)&(local_2d8->utxo).descriptor);
    in_stack_fffffffffffff420 = (ConfidentialTransactionContext *)local_6e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_6e1 + 1),"",(allocator *)in_stack_fffffffffffff420);
    uVar15 = 0;
    uVar17 = 0;
    AddressFactory::ParseOutputDescriptor
              (in_stack_00001808,in_stack_00001800,in_stack_000017f8,in_stack_000017f0,
               in_stack_000017e8,in_stack_00001820);
    std::__cxx11::string::~string((string *)(local_6e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_6e1);
    cfd::core::Address::GetAddress_abi_cxx11_();
    bVar6 = std::__cxx11::string::empty();
    bVar7 = true;
    if (((bVar6 & 1) == 0) && (bVar7 = true, local_500 != kP2shP2wpkhAddress)) {
      bVar7 = local_500 == kP2shP2wshAddress;
    }
    in_stack_fffffffffffff41f = bVar7;
    std::__cxx11::string::~string(local_708);
    if (bVar7 == false) {
      local_6e8 = core::Address::GetAddressType(&(local_2d8->utxo).address);
    }
    else {
      local_6e8 = local_500;
    }
    cfd::core::Script::Script(&local_740);
    in_stack_fffffffffffff417 = cfd::core::Script::IsEmpty();
    if (((in_stack_fffffffffffff417 & 1) == 0) ||
       (in_stack_fffffffffffff416 = cfd::core::Script::IsEmpty(),
       (in_stack_fffffffffffff416 & 1) != 0)) {
      cfd::core::Script::operator=(&local_740,&(local_2d8->utxo).redeem_script);
    }
    else {
      cfd::core::Script::operator=(&local_740,local_4f8);
    }
    local_748 = (DescriptorScriptData *)0x0;
    in_stack_fffffffffffff415 = cfd::core::Script::IsEmpty();
    if (((in_stack_fffffffffffff415 & 1) == 0) &&
       (in_stack_fffffffffffff414 = cfd::core::Script::IsEmpty(),
       (in_stack_fffffffffffff414 & 1) == 0)) {
      local_748 = (DescriptorScriptData *)&(local_2d8->utxo).scriptsig_template;
    }
    local_749 = local_2d8->is_issuance & 1;
    local_74a = 0;
    local_74b = local_2d8->is_blind_issuance & 1;
    cfd::core::OutPoint::OutPoint(&local_8d8,&(local_2d8->utxo).txid,(local_2d8->utxo).vout);
    ConfidentialTransactionContext::GetTxIn
              ((ConfidentialTransactionContext *)
               CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
               (OutPoint *)in_stack_fffffffffffff340);
    core::OutPoint::~OutPoint((OutPoint *)0x4214aa);
    if ((local_2d8->is_issuance & 1U) == 0) {
      if (((local_2d8->is_issuance & 1U) == 0) && ((local_2d8->is_blind_issuance & 1U) == 0)) {
        core::ConfidentialTxInReference::GetAssetEntropy
                  ((ConfidentialTxInReference *)CONCAT44(uVar17,uVar15));
        in_stack_fffffffffffff40f = cfd::core::ByteData256::IsEmpty();
        in_stack_fffffffffffff40e = in_stack_fffffffffffff40f ^ 0xff;
        core::ByteData256::~ByteData256((ByteData256 *)0x4216c9);
        if ((in_stack_fffffffffffff40e & 1) != 0) {
          local_749 = 1;
          local_74b = local_49 & 1;
          core::ConfidentialTxInReference::GetBlindingNonce
                    ((ConfidentialTxInReference *)CONCAT44(uVar17,uVar15));
          in_stack_fffffffffffff40d = cfd::core::ByteData256::IsEmpty();
          in_stack_fffffffffffff40c = in_stack_fffffffffffff40d ^ 0xff;
          core::ByteData256::~ByteData256((ByteData256 *)0x42173b);
          if ((in_stack_fffffffffffff40c & 1) != 0) {
            local_74a = 1;
            local_74b = 1;
          }
        }
      }
    }
    else {
      local_909 = 0;
      core::ConfidentialTxInReference::GetAssetEntropy
                ((ConfidentialTxInReference *)CONCAT44(uVar17,uVar15));
      in_stack_fffffffffffff413 = cfd::core::ByteData256::IsEmpty();
      in_stack_fffffffffffff410 = 0;
      if ((in_stack_fffffffffffff413 & 1) == 0) {
        core::ConfidentialTxInReference::GetBlindingNonce
                  ((ConfidentialTxInReference *)CONCAT44(uVar17,uVar15));
        local_909 = 1;
        in_stack_fffffffffffff411 = cfd::core::ByteData256::IsEmpty();
        in_stack_fffffffffffff410 = in_stack_fffffffffffff411 ^ 0xff;
      }
      in_stack_fffffffffffff412 = in_stack_fffffffffffff410;
      if ((local_909 & 1) != 0) {
        core::ByteData256::~ByteData256((ByteData256 *)0x421577);
      }
      core::ByteData256::~ByteData256((ByteData256 *)0x421584);
      if ((in_stack_fffffffffffff410 & 1) != 0) {
        local_74a = 1;
      }
    }
    in_stack_fffffffffffff408 =
         core::ConfidentialTxInReference::GetPeginWitnessStackNum
                   ((ConfidentialTxInReference *)0x4217b9);
    if (5 < in_stack_fffffffffffff408) {
      core::ConfidentialTxInReference::GetPeginWitness
                ((ConfidentialTxInReference *)CONCAT44(uVar17,uVar15));
      cfd::core::ScriptWitness::GetWitness();
      core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x42180d);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                (local_958,4);
      in_stack_fffffffffffff400 = cfd::core::ByteData::GetDataSize();
      local_32c = (uint32_t)in_stack_fffffffffffff400;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                (local_958,5);
      local_330 = cfd::core::ByteData::GetDataSize();
      pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                         (local_958,3);
      cfd::core::Script::Script(&local_9b0,pvVar9);
      cfd::core::Script::operator=(&local_368,&local_9b0);
      core::Script::~Script((Script *)in_stack_fffffffffffff330);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 in_stack_fffffffffffff340);
    }
    local_9c9 = 0;
    local_c09 = 0;
    if ((local_2d8->is_issuance & 1U) != 0) {
      core::ConfidentialTxInReference::GetAssetEntropy
                ((ConfidentialTxInReference *)CONCAT44(uVar17,uVar15));
      local_9c9 = 1;
      local_c09 = cfd::core::ByteData256::IsEmpty();
    }
    if ((local_9c9 & 1) != 0) {
      core::ByteData256::~ByteData256((ByteData256 *)0x4219c9);
    }
    __rhs = (Script *)CONCAT44(uVar17,uVar15);
    if ((local_c09 & 1) == 0) {
      if ((local_2d8->is_pegin & 1U) != 0) {
        uVar8 = core::ConfidentialTxInReference::GetPeginWitnessStackNum
                          ((ConfidentialTxInReference *)0x421a2b);
        __rhs = (Script *)CONCAT44(uVar17,uVar15);
        if (uVar8 < 6) goto LAB_00421b7c;
      }
      AVar5 = local_6e8;
      cfd::core::Script::Script(&local_a08,&local_740);
      bVar6 = local_74b;
      cfd::core::Script::Script(&local_a40,&local_368);
      in_stack_fffffffffffff340 = (DescriptorScriptData *)local_2a8;
      args_1 = (long *)(local_2a8 + 4);
      __rhs = &local_a40;
      SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_748;
      SVar1._vptr_Script = (_func_int **)__rhs;
      SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = (int)args_1;
      SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)args_1 >> 0x20);
      SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff340;
      SVar1.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff348;
      SVar1.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff34c;
      SVar1.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff350;
      SVar1.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff354;
      SVar1.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)puVar18;
      SVar1.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)((ulong)puVar18 >> 0x20);
      SVar3._vptr_Script._4_4_ = in_stack_fffffffffffff364;
      SVar3._vptr_Script._0_4_ = in_stack_fffffffffffff360;
      SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff368;
      SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff36c;
      SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff370;
      SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff378;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._0_7_ = in_stack_fffffffffffff380;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._7_1_ = in_stack_fffffffffffff387;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff388;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff390;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffff394;
      in_stack_fffffffffffff330 = local_748;
      cfd::core::ConfidentialTxInReference::EstimateTxInSize
                ((AddressType)local_8b0,SVar1,SUB41(AVar5,0),(int)&local_a08,bVar6 & 1,SVar3,
                 (Script *)(ulong)in_stack_00000018,(uint *)(ulong)in_stack_00000020,
                 in_stack_fffffffffffff398);
      core::Script::~Script((Script *)in_stack_fffffffffffff330);
      core::Script::~Script((Script *)in_stack_fffffffffffff330);
    }
LAB_00421b7c:
    core::ConfidentialTxInReference::~ConfidentialTxInReference
              ((ConfidentialTxInReference *)in_stack_fffffffffffff330);
    AVar5 = local_6e8;
    uVar15 = (undefined4)((ulong)args_1 >> 0x20);
    if ((local_74a & 1) == 0) {
      if ((local_749 & 1) != 0) {
        local_2b0 = local_2b0 + 2;
      }
    }
    else {
      local_2b0 = local_2b0 + 1;
    }
    local_2b0 = local_2b0 + 1;
    if (local_2a8._0_4_ == kDescriptorScriptNull) {
      cfd::core::Script::Script(local_ac0,&local_740);
      uVar8 = local_32c;
      cfd::core::Script::Script(&local_af8,&local_368);
      puVar18 = &local_2ac;
      uVar13 = local_74a & 1;
      in_stack_fffffffffffff330 = (DescriptorScriptData *)local_2a8;
      __rhs = (Script *)(local_2a8 + 4);
      SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff330;
      SVar2._vptr_Script = (_func_int **)__rhs;
      SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = uVar13;
      SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = uVar15;
      SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_748;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_00000018;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff34c;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_00000020;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff354;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)puVar18;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)((ulong)puVar18 >> 0x20);
      SVar4._vptr_Script._4_4_ = in_stack_fffffffffffff364;
      SVar4._vptr_Script._0_4_ = local_330;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff368;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff36c;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff370;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff378;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._0_7_ = in_stack_fffffffffffff380;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._7_1_ = in_stack_fffffffffffff387;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff388;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff390;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffff394;
      in_stack_fffffffffffff340 = local_748;
      in_stack_fffffffffffff348 = in_stack_00000018;
      in_stack_fffffffffffff350 = in_stack_00000020;
      in_stack_fffffffffffff360 = local_330;
      cfd::core::ConfidentialTxIn::EstimateTxInSize
                (AVar5,SVar2,(uint)local_ac0,SVar4,SUB41(uVar8,0),SUB81(&local_af8,0),
                 (uint *)(ulong)(local_749 & 1),(uint *)(ulong)(local_74b & 1),
                 SUB81(in_stack_fffffffffffff398,0),
                 (Script *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0),
                 (int)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3b0,
                 (uint *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                 (uint)&stack0xfffffffffffff328);
      core::Script::~Script((Script *)in_stack_fffffffffffff330);
      core::Script::~Script((Script *)in_stack_fffffffffffff330);
      args_1 = (long *)CONCAT44(uVar15,uVar13);
    }
    local_29c = local_2a8._0_4_ + local_29c;
    local_2a0 = local_2a8._4_4_ + local_2a0;
    if (local_2a8._4_4_ == 0) {
      local_2b4 = local_2b4 + 1;
    }
    core::Script::~Script((Script *)in_stack_fffffffffffff330);
    DescriptorScriptData::~DescriptorScriptData(in_stack_fffffffffffff330);
    std::__cxx11::string::~string(local_388);
    core::Script::~Script((Script *)in_stack_fffffffffffff330);
    ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x421f0f);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
    ::operator++(&local_2c8);
  } while( true );
}

Assistant:

Amount ElementsTransactionApi::EstimateFee(
    const std::string& tx_hex, const std::vector<ElementsUtxoAndOption>& utxos,
    const ConfidentialAssetId& fee_asset, Amount* txout_fee, Amount* utxo_fee,
    bool is_blind, uint64_t effective_fee_rate, int exponent, int minimum_bits,
    uint32_t* append_asset_count) const {
  ConfidentialTransactionContext txc(tx_hex);

  if (fee_asset.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to EstimateFee. Empty fee asset.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty fee asset.");
  }

  // check fee in txout
  bool exist_fee = false;
  for (const auto& txout : txc.GetTxOutList()) {
    if (txout.GetLockingScript().IsEmpty()) {
      if (txout.GetAsset().GetHex() != fee_asset.GetHex()) {
        warn(CFD_LOG_SOURCE, "Failed to EstimateFee. Unmatch fee asset.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Unmatch fee asset.");
      }
      exist_fee = true;
      break;
    }
  }
  if (!exist_fee) {
    txc.AddTxOutFee(Amount::CreateBySatoshiAmount(1), fee_asset);  // dummy fee
  }

  uint32_t size = 0;
  uint32_t witness_size = 0;
  uint32_t wit_size = 0;
  uint32_t txin_size = 0;
  uint32_t rangeproof_size_cache = 0;
  uint32_t asset_count = 0;
  uint32_t not_witness_count = 0;
  for (const auto& utxo : utxos) {
    NetType net_type = NetType::kLiquidV1;
    if (!utxo.utxo.address.GetAddress().empty()) {
      net_type = utxo.utxo.address.GetNetType();
    }
    ElementsAddressFactory factory(net_type);

    uint32_t pegin_btc_tx_size = 0;
    uint32_t pegin_txoutproof_size = 0;
    txin_size = 0;
    wit_size = 0;
    Script claim_script;
    if (utxo.is_pegin) {
      pegin_btc_tx_size = utxo.pegin_btc_tx_size;
      pegin_txoutproof_size = utxo.pegin_txoutproof_size;
      claim_script = utxo.claim_script;
    }
    // check descriptor
    std::string descriptor = utxo.utxo.descriptor;
    // set dummy NetType for getting AddressType.
    auto data = factory.ParseOutputDescriptor(descriptor, "");

    AddressType addr_type;
    if (utxo.utxo.address.GetAddress().empty() ||
        data.address_type == AddressType::kP2shP2wpkhAddress ||
        data.address_type == AddressType::kP2shP2wshAddress) {
      addr_type = data.address_type;
    } else {
      addr_type = utxo.utxo.address.GetAddressType();
    }

    Script redeem_script;
    if (utxo.utxo.redeem_script.IsEmpty() && !data.redeem_script.IsEmpty()) {
      redeem_script = data.redeem_script;
    } else {
      redeem_script = utxo.utxo.redeem_script;
    }
    const Script* scriptsig_template = nullptr;
    if ((!redeem_script.IsEmpty()) &&
        (!utxo.utxo.scriptsig_template.IsEmpty())) {
      scriptsig_template = &utxo.utxo.scriptsig_template;
    }
    bool is_issuance = utxo.is_issuance;
    bool is_reissuance = false;
    bool is_blind_issuance = utxo.is_blind_issuance;
    try {
      auto ref = txc.GetTxIn(OutPoint(utxo.utxo.txid, utxo.utxo.vout));
      if (utxo.is_issuance) {
        if ((!ref.GetAssetEntropy().IsEmpty()) &&
            (!ref.GetBlindingNonce().IsEmpty())) {
          is_reissuance = true;
        }
      } else if ((!utxo.is_issuance) && (!utxo.is_blind_issuance)) {  // init
        if (!ref.GetAssetEntropy().IsEmpty()) {
          is_issuance = true;
          is_blind_issuance = is_blind;
          if (!ref.GetBlindingNonce().IsEmpty()) {
            is_reissuance = true;
            is_blind_issuance = true;
          }
        }
      }
      if (ref.GetPeginWitnessStackNum() >= 6) {
        std::vector<ByteData> pegin_stack = ref.GetPeginWitness().GetWitness();
        pegin_btc_tx_size =
            static_cast<uint32_t>(pegin_stack[4].GetDataSize());
        pegin_txoutproof_size =
            static_cast<uint32_t>(pegin_stack[5].GetDataSize());
        claim_script = Script(pegin_stack[3]);
      }

      if (utxo.is_issuance && ref.GetAssetEntropy().IsEmpty()) {
        // unmatch pattern. (using input utxo data)
      } else if (utxo.is_pegin && (ref.GetPeginWitnessStackNum() < 6)) {
        // unmatch pattern. (using input utxo data)
      } else {
        ref.EstimateTxInSize(
            addr_type, redeem_script, is_blind_issuance, exponent,
            minimum_bits, claim_script, scriptsig_template, &wit_size,
            &txin_size);
      }
    } catch (const CfdException& except) {
      info(CFD_LOG_SOURCE, "Error:{}", std::string(except.what()));
    }

    if (is_reissuance)
      ++asset_count;
    else if (is_issuance)
      asset_count += 2;

    ++asset_count;
    if (txin_size == 0) {
      ConfidentialTxIn::EstimateTxInSize(
          addr_type, redeem_script, pegin_btc_tx_size, claim_script,
          is_issuance, is_blind_issuance, &wit_size, &txin_size, is_reissuance,
          scriptsig_template, exponent, minimum_bits, &rangeproof_size_cache,
          pegin_txoutproof_size);
    }
    size += txin_size;
    witness_size += wit_size;
    if (wit_size == 0) ++not_witness_count;
  }
  if ((witness_size != 0) && (not_witness_count != 0) &&
      (not_witness_count < static_cast<uint32_t>(utxos.size()))) {
    // append witness size for p2pkh or p2sh
    witness_size += not_witness_count * 4;
  }

  uint32_t utxo_vsize =
      AbstractTransaction::GetVsizeFromSize(size, witness_size);

  uint32_t tx_witness_size = 0;
  uint32_t tx_size = 0;
  if (append_asset_count != nullptr) {
    if ((asset_count + *append_asset_count) < 255) {
      asset_count += *append_asset_count;
    } else {
      asset_count = 255;
    }
  }
  txc.GetSizeIgnoreTxIn(
      is_blind, &tx_witness_size, &tx_size, exponent, minimum_bits,
      asset_count);
  uint32_t tx_vsize =
      AbstractTransaction::GetVsizeFromSize(tx_size, tx_witness_size);

  FeeCalculator fee_calc(effective_fee_rate);
  Amount tx_fee_amount = fee_calc.GetFee(tx_vsize);
  Amount utxo_fee_amount = fee_calc.GetFee(utxo_vsize);
  uint32_t total_vsize = AbstractTransaction::GetVsizeFromSize(
      tx_size + size, tx_witness_size + witness_size);
  Amount fee = fee_calc.GetFee(total_vsize);

  if (txout_fee) *txout_fee = tx_fee_amount;
  if (utxo_fee) *utxo_fee = utxo_fee_amount;

  info(
      CFD_LOG_SOURCE, "EstimateFee rate={} fee={} tx={} utxo={}",
      effective_fee_rate, fee.GetSatoshiValue(),
      tx_fee_amount.GetSatoshiValue(), utxo_fee_amount.GetSatoshiValue());
  return fee;
}